

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Array<double,3,3,0,3,3>>::resizeLike<Eigen::Matrix<double,3,3,0,3,3>>
          (PlainObjectBase<Eigen::Array<double,3,3,0,3,3>> *this,
          EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *_other)

{
  PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_00;
  Index rows;
  Index cols;
  Index othersize;
  Matrix<double,_3,_3,_0,_3,_3> *other;
  EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *_other_local;
  PlainObjectBase<Eigen::Array<double,_3,_3,_0,_3,_3>_> *this_local;
  
  this_00 = &EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::derived(_other)->
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
  PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::rows(this_00);
  PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols(this_00);
  PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::rows(this_00);
  PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols(this_00);
  rows = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::rows(this_00);
  cols = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols(this_00);
  PlainObjectBase<Eigen::Array<double,_3,_3,_0,_3,_3>_>::resize
            ((PlainObjectBase<Eigen::Array<double,_3,_3,_0,_3,_3>_> *)this,rows,cols);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }